

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_PiecewiseLinearExprPrecedence_Test::TestBody
          (ExprWriterTest_PiecewiseLinearExprPrecedence_Test *this)

{
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_00;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *args;
  bool bVar1;
  Impl *pIVar2;
  Impl *pIVar3;
  char *message;
  Impl *impl;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  string local_68;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Impl *local_38;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory.exprs_;
  local_68._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_68);
  pIVar2 = (Impl *)operator_new__(0x1c0);
  pIVar2->kind_ = PLTERM;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar2;
  pIVar2[1].kind_ = FIRST_REFERENCE;
  *(undefined8 *)(pIVar2 + 4) = 0xbff0000000000000;
  *(undefined8 *)(pIVar2 + 6) = 0x4014000000000000;
  pIVar2[8].kind_ = UNKNOWN;
  pIVar2[9].kind_ = UNKNOWN;
  pIVar2[10].kind_ = UNKNOWN;
  pIVar2[0xb].kind_ = 0x40240000;
  *(undefined8 *)(pIVar2 + 0xc) = 0x3ff0000000000000;
  local_70.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_70);
  pIVar3 = (Impl *)operator_new__(0x40);
  pIVar3->kind_ = FIRST_REFERENCE;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar3;
  pIVar3[1].kind_ = FIRST_ITERATED;
  *(Impl **)(pIVar2 + 2) = pIVar3;
  local_70.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_70);
  pIVar3 = (Impl *)operator_new__(0x80);
  pIVar3->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar3;
  *(undefined8 *)(pIVar3 + 2) = 0x4000000000000000;
  local_70.data_ = (AssertHelperData *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_70);
  local_38 = (Impl *)operator_new__(0xc0);
  local_38->kind_ = POW;
  args = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
         (this->super_ExprWriterTest).super_ExprFactory.exprs_.
         super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  args[-1].super_ExprBase.impl_ = local_38;
  *(Impl **)(local_38 + 2) = pIVar2;
  *(Impl **)(local_38 + 4) = pIVar3;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_68,(fmt *)0x1684bd,(CStringRef)&local_38,args);
  testing::internal::CmpHelperEQ<char[28],std::__cxx11::string>
            (local_48,"\"<<5, 10; -1, 0, 1>> x43 ^ 2\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeBinary(ex::POW, EndPLTerm(plterm, MakeVariable(42)), MakeConst(2))))"
             ,(char (*) [28])"<<5, 10; -1, 0, 1>> x43 ^ 2",&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x222,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, PiecewiseLinearExprPrecedence) {
  auto plterm = BeginPLTerm(2);
  plterm.AddSlope(-1);
  plterm.AddBreakpoint(5);
  plterm.AddSlope(0);
  plterm.AddBreakpoint(10);
  plterm.AddSlope(1);
  CHECK_WRITE("<<5, 10; -1, 0, 1>> x43 ^ 2",
      MakeBinary(ex::POW, EndPLTerm(plterm, MakeVariable(42)), MakeConst(2)));
}